

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O1

void CreateBackwardReferencesDH41
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  long lVar1;
  long lVar2;
  uint8_t *puVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  BrotliEncoderDictionary *pBVar7;
  void *pvVar8;
  PreparedDictionary *pPVar9;
  void *pvVar10;
  HasherCommon *pHVar11;
  BrotliDictionary *pBVar12;
  bool bVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  uint32_t *puVar17;
  ushort uVar18;
  uint32_t uVar19;
  uint32_t *puVar20;
  ulong *puVar21;
  long lVar22;
  ulong uVar23;
  uint32_t *puVar24;
  ulong *puVar25;
  byte bVar26;
  ulong uVar27;
  uint8_t *puVar28;
  ulong *puVar29;
  ulong *puVar30;
  int iVar31;
  uint32_t *puVar32;
  uint32_t *puVar33;
  undefined8 *puVar34;
  undefined8 *puVar35;
  uint32_t *puVar36;
  ulong *puVar37;
  BankH41 *banks;
  uint8_t *puVar38;
  size_t sVar39;
  size_t key;
  ulong uVar40;
  uint32_t *puVar41;
  uint32_t *puVar42;
  uint32_t *puVar43;
  uint8_t *puVar44;
  uint16_t uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint *puVar49;
  uint32_t *puVar50;
  byte bVar51;
  ushort uVar52;
  long lVar53;
  undefined8 *puVar54;
  uint32_t *puVar55;
  char cVar56;
  uint32_t *puVar57;
  uint32_t *puVar58;
  ulong uVar59;
  undefined8 *puVar60;
  uint8_t uVar61;
  uint8_t *puVar62;
  uint8_t *puVar63;
  ulong uVar64;
  uint32_t *addr;
  uint32_t *puVar65;
  uint8_t *s1_orig_2;
  uint32_t *puVar66;
  size_t sVar67;
  bool bVar68;
  uint32_t *local_170;
  ulong local_160;
  int local_154;
  int local_150;
  uint32_t *local_148;
  uint32_t *local_140;
  uint32_t *local_130;
  uint32_t *local_128;
  uint32_t *local_120;
  uint8_t *local_110;
  uint8_t *local_f8;
  uint32_t *local_f0;
  size_t local_e8;
  uint32_t *local_e0;
  uint8_t *local_d0;
  Command *local_b8;
  ulong local_a8;
  uint local_94;
  uint8_t *s1_orig_1;
  int last_distance;
  
  iVar31 = params->lgwin;
  sVar5 = params->stream_offset;
  local_e8 = *last_insert_len;
  puVar20 = (uint32_t *)((position - 3) + num_bytes);
  if (num_bytes < 4) {
    puVar20 = (uint32_t *)position;
  }
  puVar3 = (uint8_t *)(position + num_bytes);
  lVar53 = 0x200;
  if (params->quality < 9) {
    lVar53 = 0x40;
  }
  sVar6 = (params->dictionary).compound.total_size;
  iVar4 = *dist_cache;
  dist_cache[4] = iVar4 + -1;
  dist_cache[5] = iVar4 + 1;
  dist_cache[6] = iVar4 + -2;
  dist_cache[7] = iVar4 + 2;
  *(ulong *)(dist_cache + 8) = CONCAT44(iVar4 + 3,iVar4 + -3);
  if ((uint8_t *)(position + 4) < puVar3) {
    puVar32 = (uint32_t *)((1L << ((byte)iVar31 & 0x3f)) + -0x10);
    local_d0 = (uint8_t *)(lVar53 + position);
    lVar1 = sVar6 + 1;
    local_b8 = commands;
    local_130 = (uint32_t *)position;
    do {
      puVar41 = puVar32;
      if (local_130 < puVar32) {
        puVar41 = local_130;
      }
      puVar42 = (uint32_t *)((long)local_130 + sVar5);
      if (puVar32 <= (uint32_t *)((long)local_130 + sVar5)) {
        puVar42 = puVar32;
      }
      if ((params->dictionary).contextual.context_based == 0) {
        local_94 = 0;
        local_a8 = 0;
      }
      else {
        if (local_130 == (uint32_t *)0x0) {
          local_a8 = 0;
        }
        else {
          local_a8 = (ulong)ringbuffer[(ulong)((long)local_130 + -1) & ringbuffer_mask];
        }
        if (local_130 < (uint32_t *)0x2) {
          uVar27 = 0;
        }
        else {
          uVar27 = (ulong)ringbuffer[(ulong)((long)local_130 + -2) & ringbuffer_mask];
        }
        local_94 = (uint)(params->dictionary).contextual.context_map
                         [literal_context_lut[uVar27 + 0x100] | literal_context_lut[local_a8]];
      }
      local_140 = (uint32_t *)(puVar3 + -(long)local_130);
      pBVar7 = (params->dictionary).contextual.dict[local_94];
      puVar44 = (uint8_t *)(params->dist).max_distance;
      puVar33 = (uint32_t *)(hasher->privat)._H40.extra[0];
      pvVar8 = (hasher->privat)._H40.extra[1];
      uVar27 = (ulong)local_130 & ringbuffer_mask;
      puVar21 = (ulong *)(ringbuffer + uVar27);
      uVar46 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0x11;
      local_f0 = (uint32_t *)0x7e4;
      puVar65 = (uint32_t *)0x0;
      lVar22 = 0;
      local_170 = (uint32_t *)0x0;
      local_110 = (uint8_t *)0x0;
      local_120 = (uint32_t *)0x7e4;
      do {
        puVar38 = (uint8_t *)(long)dist_cache[lVar22];
        puVar28 = (uint8_t *)((long)local_130 - (long)puVar38);
        uVar61 = (uint8_t)uVar46;
        if ((((lVar22 == 0) ||
             (*(uint8_t *)((long)puVar33 + ((ulong)puVar28 & 0xffff) + 0x30000) == uVar61)) &&
            (puVar38 <= puVar41)) && (puVar28 < local_130)) {
          puVar29 = (ulong *)(ringbuffer + ((ulong)puVar28 & ringbuffer_mask));
          puVar37 = puVar21;
          puVar30 = puVar29;
          puVar66 = local_130;
          for (puVar57 = local_140; (uint32_t *)0x7 < puVar57; puVar57 = puVar57 + -2) {
            uVar23 = *puVar37;
            uVar40 = *puVar30;
            if (uVar23 == uVar40) {
              puVar30 = puVar30 + 1;
            }
            else {
              uVar59 = 0;
              if ((uVar40 ^ uVar23) != 0) {
                for (; ((uVar40 ^ uVar23) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                }
              }
              puVar66 = (uint32_t *)((long)puVar30 + ((uVar59 >> 3 & 0x1fffffff) - (long)puVar29));
            }
            if (uVar23 != uVar40) goto LAB_01122db0;
            puVar37 = puVar37 + 1;
          }
          puVar25 = puVar30;
          if (puVar57 != (uint32_t *)0x0) {
            puVar25 = (ulong *)((long)puVar30 + (long)puVar57);
            puVar28 = (uint8_t *)0x0;
            do {
              if (*(uint8_t *)((long)puVar30 + (long)puVar28) !=
                  *(uint8_t *)((long)puVar37 + (long)puVar28)) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar28);
                break;
              }
              puVar28 = puVar28 + 1;
            } while (puVar57 != (uint32_t *)puVar28);
          }
          puVar66 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_01122db0:
          if ((&DAT_00000001 < puVar66) &&
             (puVar57 = (uint32_t *)((long)puVar66 * 0x87 + 0x78f), local_f0 < puVar57)) {
            if (lVar22 != 0) {
              puVar57 = (uint32_t *)
                        ((long)puVar57 - (ulong)((0x1ca10U >> ((byte)lVar22 & 0xe) & 0xe) + 0x27));
            }
            if (local_f0 < puVar57) {
              local_170 = puVar66;
              local_120 = puVar57;
              puVar65 = puVar66;
              local_110 = puVar38;
              local_f0 = puVar57;
            }
          }
        }
        lVar22 = lVar22 + 1;
      } while (lVar22 != 10);
      uVar40 = (ulong)uVar46;
      sVar67 = (hasher->privat)._H5.block_size_;
      uVar59 = (long)local_130 - (ulong)puVar33[uVar40];
      uVar23 = (ulong)*(ushort *)((long)puVar33 + uVar40 * 2 + 0x20000);
      puVar28 = (uint8_t *)0x0;
      local_160 = uVar59;
      do {
        bVar68 = sVar67 == 0;
        sVar67 = sVar67 - 1;
        if (bVar68) break;
        puVar28 = puVar28 + local_160;
        if (puVar28 <= puVar41) {
          uVar64 = (ulong)*(ushort *)((long)pvVar8 + uVar23 * 4 + 2);
          local_160 = (ulong)*(ushort *)((long)pvVar8 + uVar23 * 4);
          uVar23 = uVar64;
          if ((uint8_t *)((long)puVar65 + uVar27) <= ringbuffer_mask) {
            uVar64 = (long)local_130 - (long)puVar28 & ringbuffer_mask;
            puVar38 = (uint8_t *)((long)puVar65 + uVar64);
            if ((puVar38 <= ringbuffer_mask) &&
               (ringbuffer[(long)((long)puVar65 + uVar27)] == ringbuffer[(long)puVar38])) {
              puVar29 = (ulong *)(ringbuffer + uVar64);
              puVar37 = puVar21;
              puVar30 = puVar29;
              puVar66 = (uint32_t *)ringbuffer;
              for (puVar57 = local_140; (uint32_t *)0x7 < puVar57; puVar57 = puVar57 + -2) {
                uVar64 = *puVar37;
                uVar15 = *puVar30;
                if (uVar64 == uVar15) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar14 = 0;
                  if ((uVar15 ^ uVar64) != 0) {
                    for (; ((uVar15 ^ uVar64) >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                    }
                  }
                  puVar66 = (uint32_t *)
                            ((long)puVar30 + ((uVar14 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar64 != uVar15) goto LAB_01122f9a;
                puVar37 = puVar37 + 1;
              }
              if (puVar57 != (uint32_t *)0x0) {
                puVar66 = (uint32_t *)0x0;
                do {
                  puVar24 = puVar66;
                  if (*(uint8_t *)((long)puVar30 + (long)puVar66) !=
                      *(uint8_t *)((long)puVar37 + (long)puVar66)) break;
                  puVar66 = (uint32_t *)((long)puVar66 + 1);
                  puVar24 = puVar57;
                } while (puVar57 != puVar66);
                puVar30 = (ulong *)((long)puVar30 + (long)puVar24);
              }
              puVar66 = (uint32_t *)((long)puVar30 - (long)puVar29);
LAB_01122f9a:
              if ((uint32_t *)0x3 < puVar66) {
                iVar31 = 0x1f;
                if ((uint)puVar28 != 0) {
                  for (; (uint)puVar28 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                  }
                }
                puVar57 = (uint32_t *)((ulong)(iVar31 * -0x1e + 0x780) + (long)puVar66 * 0x87);
                if (local_f0 < puVar57) {
                  local_120 = puVar57;
                  puVar65 = puVar66;
                  local_170 = puVar66;
                  local_110 = puVar28;
                  local_f0 = puVar57;
                }
              }
            }
          }
        }
      } while (puVar28 <= puVar41);
      uVar52 = (hasher->privat)._H42.free_slot_idx[0];
      (hasher->privat)._H42.free_slot_idx[0] = uVar52 + 1;
      if (0xfffe < uVar59) {
        uVar59 = 0xffff;
      }
      *(uint8_t *)((long)puVar33 + ((ulong)local_130 & 0xffff) + 0x30000) = uVar61;
      *(short *)((long)pvVar8 + (ulong)uVar52 * 4) = (short)uVar59;
      *(undefined2 *)((long)pvVar8 + (ulong)uVar52 * 4 + 2) =
           *(undefined2 *)((long)puVar33 + uVar40 * 2 + 0x20000);
      puVar33[uVar40] = (uint32_t)local_130;
      *(ushort *)((long)puVar33 + uVar40 * 2 + 0x20000) = uVar52;
      local_154 = 0;
      local_e0 = local_170;
      local_128 = local_120;
      if ((local_120 == (uint32_t *)0x7e4) &&
         (puVar33 = *(uint32_t **)&(hasher->privat)._H65.ha.num_last_distances_to_check_,
         *(ulong *)(puVar33 + 10) >> 7 <= *(ulong *)(puVar33 + 0xc))) {
        uVar23 = (ulong)((uint)((int)*puVar21 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        puVar28 = pBVar7->hash_table_lengths;
        lVar22 = *(long *)(puVar33 + 10);
        local_154 = 0;
        puVar41 = (uint32_t *)ringbuffer_mask;
        puVar65 = (uint32_t *)0x0;
        do {
          lVar22 = lVar22 + 1;
          *(long *)(puVar33 + 10) = lVar22;
          bVar26 = puVar28[uVar23];
          puVar38 = (uint8_t *)(ulong)bVar26;
          if (puVar38 != (uint8_t *)0x0) {
            bVar68 = true;
            if (puVar38 <= local_140) {
              pBVar12 = pBVar7->words;
              puVar30 = (ulong *)(pBVar12->data +
                                 (ulong)pBVar12->offsets_by_length[(long)puVar38] +
                                 (ulong)pBVar7->hash_table_words[uVar23] * (long)puVar38);
              puVar37 = puVar21;
              puVar62 = puVar38;
              if (7 < bVar26) {
                do {
                  uVar40 = *puVar30;
                  uVar59 = *puVar37;
                  if (uVar40 == uVar59) {
                    puVar37 = puVar37 + 1;
                  }
                  else {
                    uVar64 = 0;
                    if ((uVar59 ^ uVar40) != 0) {
                      for (; ((uVar59 ^ uVar40) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                      }
                    }
                    puVar41 = (uint32_t *)
                              ((long)puVar37 + ((uVar64 >> 3 & 0x1fffffff) - (long)puVar21));
                  }
                  if (uVar40 != uVar59) goto LAB_01124182;
                  puVar30 = puVar30 + 1;
                  puVar62 = puVar62 + -8;
                } while ((uint8_t *)0x7 < puVar62);
              }
              puVar29 = puVar37;
              if (puVar62 != (uint8_t *)0x0) {
                puVar29 = (ulong *)((long)puVar37 + (long)puVar62);
                puVar63 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar37 + (long)puVar63) !=
                      *(uint8_t *)((long)puVar30 + (long)puVar63)) {
                    puVar29 = (ulong *)((long)puVar37 + (long)puVar63);
                    break;
                  }
                  puVar63 = puVar63 + 1;
                } while (puVar62 != puVar63);
              }
              puVar41 = (uint32_t *)((long)puVar29 - (long)puVar21);
LAB_01124182:
              bVar68 = true;
              if (((puVar41 != (uint32_t *)0x0) &&
                  (puVar38 < (uint8_t *)((long)puVar41 + (ulong)pBVar7->cutoffTransformsCount))) &&
                 (puVar38 = (uint8_t *)
                            ((long)puVar42 +
                            ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                           ((char)((long)puVar38 - (long)puVar41) * '\x06' & 0x3fU))
                                    & 0x3f) + ((long)puVar38 - (long)puVar41) * 4 <<
                            (puVar38[(long)pBVar12] & 0x3f)) +
                            (ulong)pBVar7->hash_table_words[uVar23] + lVar1), puVar38 <= puVar44)) {
                iVar31 = 0x1f;
                if ((uint)puVar38 != 0) {
                  for (; (uint)puVar38 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                  }
                }
                puVar57 = (uint32_t *)
                          (((long)puVar41 * 0x87 - (ulong)(uint)(iVar31 * 0x1e)) + 0x780);
                if (local_128 <= puVar57) {
                  local_154 = (uint)bVar26 - (int)puVar41;
                  bVar68 = false;
                  local_170 = puVar41;
                  local_128 = puVar57;
                  local_110 = puVar38;
                }
              }
            }
            if (!bVar68) {
              *(long *)(puVar33 + 0xc) = *(long *)(puVar33 + 0xc) + 1;
            }
          }
          local_120 = (uint32_t *)((long)puVar65 + 1);
          uVar23 = uVar23 + 1;
          bVar68 = puVar65 == (uint32_t *)0x0;
          puVar65 = local_120;
          local_e0 = local_170;
        } while (bVar68);
      }
      puVar44 = (uint8_t *)(params->dictionary).compound.num_chunks;
      if (puVar44 != (uint8_t *)0x0) {
        local_120 = (uint32_t *)0x0;
        do {
          pPVar9 = (params->dictionary).compound.chunks[(long)local_120];
          bVar26 = (byte)pPVar9->bucket_bits;
          bVar51 = (byte)pPVar9->slot_bits;
          bVar16 = -(char)pPVar9->hash_bits;
          uVar23 = ((*puVar21 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                   (-bVar26 & 0x3f);
          lVar22 = (1L << (bVar51 & 0x3f)) * 4;
          lVar2 = (1L << (bVar26 & 0x3f)) * 2;
          bVar51 = -bVar51;
          puVar54 = (undefined8 *)
                    ((long)&pPVar9[1].magic + (ulong)pPVar9->num_items * 4 + lVar2 + lVar22);
          if (pPVar9->magic != 0xdebcede0) {
            puVar54 = (undefined8 *)*puVar54;
          }
          puVar28 = (uint8_t *)
                    ((long)puVar42 +
                    ((params->dictionary).compound.total_size -
                    (params->dictionary).compound.chunk_offsets[(long)local_120]));
          uVar40 = (ulong)pPVar9->source_size;
          uVar52 = *(ushort *)((long)&pPVar9[1].magic + (uVar23 & 0xffffffff) * 2 + lVar22);
          puVar49 = (uint *)((long)&pPVar9[1].magic +
                            (ulong)((uint)uVar52 +
                                   (&pPVar9[1].magic)
                                   [(uint)((int)uVar23 << (bVar51 & 0x1f)) >> (bVar51 & 0x1f)]) * 4
                            + lVar2 + lVar22);
          lVar22 = 0;
          local_170 = local_e0;
          do {
            puVar38 = (uint8_t *)(long)dist_cache[lVar22];
            if ((puVar28 + -uVar40 < puVar38) && (puVar38 <= puVar28)) {
              puVar41 = (uint32_t *)(uVar40 - ((long)puVar28 - (long)puVar38));
              if (local_140 <= puVar41) {
                puVar41 = local_140;
              }
              puVar29 = (ulong *)(((long)puVar28 - (long)puVar38) + (long)puVar54);
              puVar37 = puVar21;
              puVar30 = puVar29;
              for (; (uint32_t *)0x7 < puVar41; puVar41 = puVar41 + -2) {
                uVar23 = *puVar37;
                uVar59 = *puVar30;
                if (uVar23 == uVar59) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar64 = 0;
                  if ((uVar59 ^ uVar23) != 0) {
                    for (; ((uVar59 ^ uVar23) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                    }
                  }
                  puVar33 = (uint32_t *)
                            ((long)puVar30 + ((uVar64 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar23 != uVar59) goto LAB_01123238;
                puVar37 = puVar37 + 1;
              }
              puVar25 = puVar30;
              if (puVar41 != (uint32_t *)0x0) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar41);
                puVar62 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar30 + (long)puVar62) !=
                      *(uint8_t *)((long)puVar37 + (long)puVar62)) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar62);
                    break;
                  }
                  puVar62 = puVar62 + 1;
                } while (puVar41 != (uint32_t *)puVar62);
              }
              puVar33 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_01123238:
              if ((&DAT_00000001 < puVar33) &&
                 (puVar41 = (uint32_t *)((long)puVar33 * 0x87 + 0x78f), local_128 < puVar41)) {
                if (lVar22 != 0) {
                  puVar41 = (uint32_t *)
                            ((long)puVar41 - (ulong)((0x1ca10U >> ((byte)lVar22 & 2) & 4) + 0x27));
                }
                if (local_128 < puVar41) {
                  if (local_170 < puVar33) {
                    local_170 = puVar33;
                  }
                  local_154 = 0;
                  local_128 = puVar41;
                  local_110 = puVar38;
                  local_e0 = puVar33;
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 4);
          puVar41 = (uint32_t *)0x4;
          if (uVar52 != 0xffff) {
            do {
              uVar46 = *puVar49;
              uVar23 = (ulong)(uVar46 & 0x7fffffff);
              puVar38 = puVar28 + -uVar23;
              puVar65 = (uint32_t *)(uVar40 - uVar23);
              if (local_140 <= (uint32_t *)(uVar40 - uVar23)) {
                puVar65 = local_140;
              }
              if ((((puVar38 <= (uint8_t *)(params->dist).max_distance) &&
                   ((uint8_t *)((long)local_170 + uVar27) <= ringbuffer_mask)) &&
                  (local_170 < puVar65)) &&
                 (ringbuffer[(long)((long)local_170 + uVar27)] ==
                  *(uint8_t *)((long)puVar54 + (long)((long)local_170 + uVar23)))) {
                puVar60 = (undefined8 *)(uVar23 + (long)puVar54);
                puVar37 = puVar21;
                puVar34 = puVar60;
                for (; (uint32_t *)0x7 < puVar65; puVar65 = puVar65 + -2) {
                  puVar33 = (uint32_t *)*puVar37;
                  puVar62 = (uint8_t *)*puVar34;
                  if (puVar33 == (uint32_t *)puVar62) {
                    puVar34 = puVar34 + 1;
                  }
                  else {
                    uVar23 = 0;
                    if (((ulong)puVar62 ^ (ulong)puVar33) != 0) {
                      for (; (((ulong)puVar62 ^ (ulong)puVar33) >> uVar23 & 1) == 0;
                          uVar23 = uVar23 + 1) {
                      }
                    }
                    puVar41 = (uint32_t *)
                              ((long)puVar34 + ((uVar23 >> 3 & 0x1fffffff) - (long)puVar60));
                  }
                  if (puVar33 != (uint32_t *)puVar62) goto LAB_011233ac;
                  puVar37 = puVar37 + 1;
                }
                puVar35 = puVar34;
                if (puVar65 != (uint32_t *)0x0) {
                  puVar35 = (undefined8 *)((long)puVar34 + (long)puVar65);
                  puVar62 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar34 + (long)puVar62) !=
                        *(uint8_t *)((long)puVar37 + (long)puVar62)) {
                      puVar35 = (undefined8 *)((long)puVar34 + (long)puVar62);
                      break;
                    }
                    puVar62 = puVar62 + 1;
                  } while (puVar65 != (uint32_t *)puVar62);
                }
                puVar41 = (uint32_t *)((long)puVar35 - (long)puVar60);
LAB_011233ac:
                if ((uint32_t *)0x3 < puVar41) {
                  iVar31 = 0x1f;
                  if ((uint)puVar38 != 0) {
                    for (; (uint)puVar38 >> iVar31 == 0; iVar31 = iVar31 + -1) {
                    }
                  }
                  puVar65 = (uint32_t *)((ulong)(iVar31 * -0x1e + 0x780) + (long)puVar41 * 0x87);
                  if (local_128 < puVar65) {
                    local_154 = 0;
                    local_170 = puVar41;
                    local_128 = puVar65;
                    local_110 = puVar38;
                    local_e0 = puVar41;
                  }
                }
              }
              puVar49 = puVar49 + 1;
            } while (-1 < (int)uVar46);
          }
          local_120 = (uint32_t *)((long)local_120 + 1);
        } while (local_120 != (uint32_t *)puVar44);
      }
      if (local_128 < (uint32_t *)0x7e5) {
        local_e8 = local_e8 + 1;
        position = (long)local_130 + 1;
        if (local_d0 < position) {
          if (local_d0 + (uint)((int)lVar53 * 4) < position) {
            puVar44 = (uint8_t *)((long)local_130 + 0x11);
            if (puVar3 + -4 <= (uint8_t *)((long)local_130 + 0x11)) {
              puVar44 = puVar3 + -4;
            }
            if (puVar44 <= position) goto LAB_01124690;
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar10 = (hasher->privat)._H40.extra[1];
            uVar52 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar46 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar27 = (ulong)uVar46;
              uVar23 = position - *(uint *)((long)pvVar8 + uVar27 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar46;
              if (0xfffe < uVar23) {
                uVar23 = 0xffff;
              }
              uVar18 = uVar52 + 1;
              *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar23;
              *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
                   *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
              *(int *)((long)pvVar8 + uVar27 * 4) = (int)position;
              *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar52;
              local_e8 = local_e8 + 4;
              position = position + 4;
              uVar52 = uVar18;
            } while (position < puVar44);
            goto LAB_01124669;
          }
          puVar44 = (uint8_t *)((long)local_130 + 9);
          if (puVar3 + -3 <= (uint8_t *)((long)local_130 + 9)) {
            puVar44 = puVar3 + -3;
          }
          if (position < puVar44) {
            pvVar8 = (hasher->privat)._H40.extra[0];
            pvVar10 = (hasher->privat)._H40.extra[1];
            uVar52 = (hasher->privat)._H42.free_slot_idx[0];
            do {
              uVar46 = (uint)(*(int *)(ringbuffer + (position & ringbuffer_mask)) * 0x1e35a7bd) >>
                       0x11;
              uVar27 = (ulong)uVar46;
              uVar23 = position - *(uint *)((long)pvVar8 + uVar27 * 4);
              *(char *)((long)pvVar8 + (position & 0xffff) + 0x30000) = (char)uVar46;
              if (0xfffe < uVar23) {
                uVar23 = 0xffff;
              }
              uVar18 = uVar52 + 1;
              *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar23;
              *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
                   *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
              *(int *)((long)pvVar8 + uVar27 * 4) = (int)position;
              *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar52;
              local_e8 = local_e8 + 2;
              position = position + 2;
              uVar52 = uVar18;
            } while (position < puVar44);
            goto LAB_01124669;
          }
        }
      }
      else {
        uVar52 = (hasher->privat)._H42.free_slot_idx[0];
        iVar31 = 0;
        do {
          puVar41 = local_130;
          local_140 = (uint32_t *)((long)local_140 + -1);
          puVar42 = (uint32_t *)((long)local_e0 + -1);
          if (local_140 <= (uint32_t *)((long)local_e0 + -1)) {
            puVar42 = local_140;
          }
          if (4 < params->quality) {
            puVar42 = (uint32_t *)0x0;
          }
          puVar33 = (uint32_t *)((long)local_130 + 1);
          puVar65 = puVar32;
          if (puVar33 < puVar32) {
            puVar65 = puVar33;
          }
          puVar57 = (uint32_t *)((long)local_130 + sVar5 + 1);
          if (puVar32 <= puVar57) {
            puVar57 = puVar32;
          }
          if ((params->dictionary).contextual.context_based != 0) {
            local_94 = (uint)(params->dictionary).contextual.context_map
                             [literal_context_lut[local_a8 + 0x100] |
                              literal_context_lut[ringbuffer[(ulong)local_130 & ringbuffer_mask]]];
            local_a8 = (ulong)ringbuffer[(ulong)local_130 & ringbuffer_mask];
          }
          pBVar7 = (params->dictionary).contextual.dict[local_94];
          puVar44 = (uint8_t *)(params->dist).max_distance;
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar10 = (hasher->privat)._H40.extra[1];
          uVar27 = (ulong)puVar33 & ringbuffer_mask;
          puVar21 = (ulong *)(ringbuffer + uVar27);
          uVar46 = (uint)(*(int *)(ringbuffer + uVar27) * 0x1e35a7bd) >> 0x11;
          local_148 = (uint32_t *)0x7e4;
          lVar22 = 0;
          puVar24 = (uint32_t *)0x0;
          local_f8 = (uint8_t *)0x0;
          puVar66 = (uint32_t *)0x7e4;
          do {
            puVar38 = (uint8_t *)(long)dist_cache[lVar22];
            puVar28 = (uint8_t *)((long)puVar33 - (long)puVar38);
            cVar56 = (char)uVar46;
            if (((lVar22 == 0) ||
                (*(char *)((long)pvVar8 + ((ulong)puVar28 & 0xffff) + 0x30000) == cVar56)) &&
               ((puVar38 <= puVar65 && (puVar28 < puVar33)))) {
              puVar29 = (ulong *)(ringbuffer + ((ulong)puVar28 & ringbuffer_mask));
              puVar37 = puVar21;
              puVar30 = puVar29;
              for (puVar36 = local_140; (uint32_t *)0x7 < puVar36; puVar36 = puVar36 + -2) {
                uVar23 = *puVar37;
                uVar40 = *puVar30;
                if (uVar23 == uVar40) {
                  puVar30 = puVar30 + 1;
                }
                else {
                  uVar59 = 0;
                  if ((uVar40 ^ uVar23) != 0) {
                    for (; ((uVar40 ^ uVar23) >> uVar59 & 1) == 0; uVar59 = uVar59 + 1) {
                    }
                  }
                  local_120 = (uint32_t *)
                              ((long)puVar30 + ((uVar59 >> 3 & 0x1fffffff) - (long)puVar29));
                }
                if (uVar23 != uVar40) goto LAB_01123658;
                puVar37 = puVar37 + 1;
              }
              puVar25 = puVar30;
              if (puVar36 != (uint32_t *)0x0) {
                puVar25 = (ulong *)((long)puVar30 + (long)puVar36);
                puVar28 = (uint8_t *)0x0;
                do {
                  if (*(uint8_t *)((long)puVar30 + (long)puVar28) !=
                      *(uint8_t *)((long)puVar37 + (long)puVar28)) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar28);
                    break;
                  }
                  puVar28 = puVar28 + 1;
                } while (puVar36 != (uint32_t *)puVar28);
              }
              local_120 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_01123658:
              if ((&DAT_00000001 < local_120) &&
                 (puVar36 = (uint32_t *)((long)local_120 * 0x87 + 0x78f), local_148 < puVar36)) {
                if (lVar22 != 0) {
                  puVar36 = (uint32_t *)
                            ((long)puVar36 -
                            (ulong)((0x1ca10U >> ((byte)lVar22 & 0xe) & 0xe) + 0x27));
                }
                if (local_148 < puVar36) {
                  puVar66 = puVar36;
                  puVar42 = local_120;
                  puVar24 = local_120;
                  local_148 = puVar36;
                  local_f8 = puVar38;
                }
              }
            }
            lVar22 = lVar22 + 1;
          } while (lVar22 != 10);
          uVar40 = (ulong)uVar46;
          sVar67 = (hasher->privat)._H5.block_size_;
          puVar50 = (uint32_t *)((long)puVar33 - (ulong)*(uint *)((long)pvVar8 + uVar40 * 4));
          uVar23 = (ulong)*(ushort *)((long)pvVar8 + uVar40 * 2 + 0x20000);
          puVar28 = (uint8_t *)0x0;
          puVar58 = puVar50;
          puVar36 = local_120;
          do {
            bVar68 = sVar67 == 0;
            sVar67 = sVar67 - 1;
            local_120 = puVar24;
            if (bVar68) break;
            puVar28 = puVar28 + (long)puVar58;
            puVar43 = puVar42;
            puVar55 = puVar66;
            puVar17 = local_148;
            puVar38 = local_f8;
            if (puVar28 <= puVar65) {
              uVar59 = (ulong)*(ushort *)((long)pvVar10 + uVar23 * 4 + 2);
              puVar58 = (uint32_t *)(ulong)*(ushort *)((long)pvVar10 + uVar23 * 4);
              uVar23 = uVar59;
              if ((uint8_t *)((long)puVar42 + uVar27) <= ringbuffer_mask) {
                uVar59 = (long)puVar33 - (long)puVar28 & ringbuffer_mask;
                puVar62 = (uint8_t *)((long)puVar42 + uVar59);
                if ((ringbuffer_mask < puVar62) ||
                   (ringbuffer[(long)((long)puVar42 + uVar27)] != ringbuffer[(long)puVar62]))
                goto LAB_01123800;
                puVar29 = (ulong *)(ringbuffer + uVar59);
                puVar37 = puVar21;
                puVar30 = puVar29;
                for (puVar43 = local_140; (uint32_t *)0x7 < puVar43; puVar43 = puVar43 + -2) {
                  uVar59 = *puVar37;
                  uVar64 = *puVar30;
                  if (uVar59 == uVar64) {
                    puVar30 = puVar30 + 1;
                  }
                  else {
                    uVar15 = 0;
                    if ((uVar64 ^ uVar59) != 0) {
                      for (; ((uVar64 ^ uVar59) >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                      }
                    }
                    puVar36 = (uint32_t *)
                              ((long)puVar30 + ((uVar15 >> 3 & 0x1fffffff) - (long)puVar29));
                  }
                  if (uVar59 != uVar64) goto LAB_0112381d;
                  puVar37 = puVar37 + 1;
                }
                puVar25 = puVar30;
                if (puVar43 != (uint32_t *)0x0) {
                  puVar25 = (ulong *)((long)puVar30 + (long)puVar43);
                  puVar38 = (uint8_t *)0x0;
                  do {
                    if (*(uint8_t *)((long)puVar30 + (long)puVar38) !=
                        *(uint8_t *)((long)puVar37 + (long)puVar38)) {
                      puVar25 = (ulong *)((long)puVar30 + (long)puVar38);
                      break;
                    }
                    puVar38 = puVar38 + 1;
                  } while (puVar43 != (uint32_t *)puVar38);
                }
                puVar36 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_0112381d:
                if ((uint32_t *)0x3 < puVar36) {
                  iVar4 = 0x1f;
                  if ((uint)puVar28 != 0) {
                    for (; (uint)puVar28 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                    }
                  }
                  puVar55 = (uint32_t *)((ulong)(iVar4 * -0x1e + 0x780) + (long)puVar36 * 0x87);
                  puVar43 = puVar36;
                  local_120 = puVar36;
                  puVar17 = puVar55;
                  puVar38 = puVar28;
                  if (local_148 < puVar55) goto LAB_01123800;
                }
              }
              puVar43 = puVar42;
              puVar55 = puVar66;
              local_120 = puVar24;
              puVar17 = local_148;
              puVar38 = local_f8;
            }
LAB_01123800:
            local_f8 = puVar38;
            local_148 = puVar17;
            puVar66 = puVar55;
            puVar42 = puVar43;
            puVar36 = local_120;
            puVar24 = local_120;
          } while (puVar28 <= puVar65);
          (hasher->privat)._H42.free_slot_idx[0] = uVar52 + 1;
          *(char *)((long)pvVar8 + ((ulong)puVar33 & 0xffff) + 0x30000) = cVar56;
          if ((uint32_t *)0xfffe < puVar50) {
            puVar50 = (uint32_t *)0xffff;
          }
          *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)puVar50;
          *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
               *(undefined2 *)((long)pvVar8 + uVar40 * 2 + 0x20000);
          *(int *)((long)pvVar8 + uVar40 * 4) = (int)puVar33;
          *(ushort *)((long)pvVar8 + uVar40 * 2 + 0x20000) = uVar52;
          local_150 = 0;
          local_148 = puVar66;
          if ((puVar66 == (uint32_t *)0x7e4) &&
             (pHVar11 = (hasher->privat)._H5.common_,
             pHVar11->dict_num_lookups >> 7 <= pHVar11->dict_num_matches)) {
            uVar23 = (ulong)((uint)((int)*puVar21 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
            puVar28 = pBVar7->hash_table_lengths;
            sVar67 = pHVar11->dict_num_lookups;
            local_150 = 0;
            lVar22 = 0;
            do {
              sVar67 = sVar67 + 1;
              pHVar11->dict_num_lookups = sVar67;
              bVar26 = puVar28[uVar23];
              puVar38 = (uint8_t *)(ulong)bVar26;
              if (puVar38 != (uint8_t *)0x0) {
                bVar68 = true;
                if (puVar38 <= local_140) {
                  pBVar12 = pBVar7->words;
                  puVar30 = (ulong *)(pBVar12->data +
                                     (ulong)pBVar12->offsets_by_length[(long)puVar38] +
                                     (ulong)pBVar7->hash_table_words[uVar23] * (long)puVar38);
                  puVar37 = puVar21;
                  puVar62 = puVar38;
                  if (7 < bVar26) {
                    do {
                      uVar40 = *puVar30;
                      uVar59 = *puVar37;
                      if (uVar40 == uVar59) {
                        puVar37 = puVar37 + 1;
                      }
                      else {
                        uVar64 = 0;
                        if ((uVar59 ^ uVar40) != 0) {
                          for (; ((uVar59 ^ uVar40) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                          }
                        }
                        puVar50 = (uint32_t *)
                                  ((long)puVar37 + ((uVar64 >> 3 & 0x1fffffff) - (long)puVar21));
                      }
                      if (uVar40 != uVar59) goto LAB_01123a22;
                      puVar30 = puVar30 + 1;
                      puVar62 = puVar62 + -8;
                    } while ((uint8_t *)0x7 < puVar62);
                  }
                  puVar29 = puVar37;
                  if (puVar62 != (uint8_t *)0x0) {
                    puVar29 = (ulong *)((long)puVar37 + (long)puVar62);
                    puVar63 = (uint8_t *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar37 + (long)puVar63) !=
                          *(uint8_t *)((long)puVar30 + (long)puVar63)) {
                        puVar29 = (ulong *)((long)puVar37 + (long)puVar63);
                        break;
                      }
                      puVar63 = puVar63 + 1;
                    } while (puVar62 != puVar63);
                  }
                  puVar50 = (uint32_t *)((long)puVar29 - (long)puVar21);
LAB_01123a22:
                  if (((puVar50 != (uint32_t *)0x0) &&
                      (puVar38 < (uint8_t *)((long)puVar50 + (ulong)pBVar7->cutoffTransformsCount)))
                     && (puVar38 = (uint8_t *)
                                   ((long)puVar57 +
                                   ((ulong)((uint)(pBVar7->cutoffTransforms >>
                                                  ((char)((long)puVar38 - (long)puVar50) * '\x06' &
                                                  0x3fU)) & 0x3f) +
                                    ((long)puVar38 - (long)puVar50) * 4 <<
                                   (puVar38[(long)pBVar12] & 0x3f)) +
                                   (ulong)pBVar7->hash_table_words[uVar23] + lVar1),
                        puVar38 <= puVar44)) {
                    iVar4 = 0x1f;
                    if ((uint)puVar38 != 0) {
                      for (; (uint)puVar38 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                      }
                    }
                    puVar42 = (uint32_t *)
                              (((long)puVar50 * 0x87 - (ulong)(uint)(iVar4 * 0x1e)) + 0x780);
                    if (local_148 <= puVar42) {
                      local_150 = (uint)bVar26 - (int)puVar50;
                      bVar68 = false;
                      local_120 = puVar50;
                      local_148 = puVar42;
                      local_f8 = puVar38;
                    }
                  }
                }
                if (!bVar68) {
                  pHVar11->dict_num_matches = pHVar11->dict_num_matches + 1;
                }
              }
              uVar23 = uVar23 + 1;
              bVar68 = lVar22 == 0;
              lVar22 = lVar22 + 1;
            } while (bVar68);
          }
          sVar67 = (params->dictionary).compound.num_chunks;
          if (sVar67 != 0) {
            sVar39 = 0;
            do {
              pPVar9 = (params->dictionary).compound.chunks[sVar39];
              bVar26 = (byte)pPVar9->bucket_bits;
              bVar51 = (byte)pPVar9->slot_bits;
              lVar22 = 1L << (bVar26 & 0x3f);
              bVar16 = -(char)pPVar9->hash_bits;
              uVar23 = ((*puVar21 << (bVar16 & 0x3f)) >> (bVar16 & 0x3f)) * 0x1fe35a7bd3579bd3 >>
                       (-bVar26 & 0x3f);
              puVar65 = &pPVar9[1].magic + (1L << (bVar51 & 0x3f));
              bVar51 = -bVar51;
              puVar42 = (uint32_t *)((long)puVar65 + (ulong)pPVar9->num_items * 4 + lVar22 * 2);
              if (pPVar9->magic != 0xdebcede0) {
                puVar42 = *(uint32_t **)puVar42;
              }
              puVar44 = (uint8_t *)
                        ((long)puVar57 +
                        ((params->dictionary).compound.total_size -
                        (params->dictionary).compound.chunk_offsets[sVar39]));
              uVar40 = (ulong)pPVar9->source_size;
              uVar18 = *(ushort *)((long)puVar65 + (uVar23 & 0xffffffff) * 2);
              puVar49 = (uint *)((long)puVar65 +
                                (ulong)((uint)uVar18 +
                                       (&pPVar9[1].magic)
                                       [(uint)((int)uVar23 << (bVar51 & 0x1f)) >> (bVar51 & 0x1f)])
                                * 4 + lVar22 * 2);
              lVar22 = 0;
              puVar66 = local_120;
              do {
                puVar28 = (uint8_t *)(long)dist_cache[lVar22];
                if ((puVar44 + -uVar40 < puVar28) && (puVar28 <= puVar44)) {
                  puVar65 = (uint32_t *)(uVar40 - ((long)puVar44 - (long)puVar28));
                  if (local_140 <= puVar65) {
                    puVar65 = local_140;
                  }
                  puVar29 = (ulong *)((long)puVar42 + ((long)puVar44 - (long)puVar28));
                  puVar37 = puVar21;
                  puVar30 = puVar29;
                  puVar24 = puVar42;
                  for (; (uint32_t *)0x7 < puVar65; puVar65 = puVar65 + -2) {
                    uVar23 = *puVar37;
                    uVar59 = *puVar30;
                    if (uVar23 == uVar59) {
                      puVar30 = puVar30 + 1;
                    }
                    else {
                      uVar64 = 0;
                      if ((uVar59 ^ uVar23) != 0) {
                        for (; ((uVar59 ^ uVar23) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                        }
                      }
                      puVar24 = (uint32_t *)
                                ((long)puVar30 + ((uVar64 >> 3 & 0x1fffffff) - (long)puVar29));
                    }
                    if (uVar23 != uVar59) goto LAB_01123ca1;
                    puVar37 = puVar37 + 1;
                  }
                  puVar25 = puVar30;
                  if (puVar65 != (uint32_t *)0x0) {
                    puVar25 = (ulong *)((long)puVar30 + (long)puVar65);
                    puVar38 = (uint8_t *)0x0;
                    do {
                      if (*(uint8_t *)((long)puVar30 + (long)puVar38) !=
                          *(uint8_t *)((long)puVar37 + (long)puVar38)) {
                        puVar25 = (ulong *)((long)puVar30 + (long)puVar38);
                        break;
                      }
                      puVar38 = puVar38 + 1;
                    } while (puVar65 != (uint32_t *)puVar38);
                  }
                  puVar24 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_01123ca1:
                  if ((&DAT_00000001 < puVar24) &&
                     (puVar36 = (uint32_t *)((long)puVar24 * 0x87 + 0x78f), local_148 < puVar36)) {
                    if (lVar22 != 0) {
                      puVar36 = (uint32_t *)
                                ((long)puVar36 -
                                (ulong)((0x1ca10U >> ((byte)lVar22 & 2) & 4) + 0x27));
                    }
                    if (local_148 < puVar36) {
                      if (puVar66 < puVar24) {
                        puVar66 = puVar24;
                      }
                      local_150 = 0;
                      local_148 = puVar36;
                      local_120 = puVar24;
                      local_f8 = puVar28;
                    }
                  }
                }
                lVar22 = lVar22 + 1;
              } while (lVar22 != 4);
              if (uVar18 != 0xffff) {
                do {
                  uVar46 = *puVar49;
                  uVar23 = (ulong)(uVar46 & 0x7fffffff);
                  puVar28 = puVar44 + -uVar23;
                  puVar24 = (uint32_t *)(uVar40 - uVar23);
                  if (local_140 <= (uint32_t *)(uVar40 - uVar23)) {
                    puVar24 = local_140;
                  }
                  if ((((puVar28 <= (uint8_t *)(params->dist).max_distance) &&
                       ((uint8_t *)((long)puVar66 + uVar27) <= ringbuffer_mask)) &&
                      (puVar66 < puVar24)) &&
                     (ringbuffer[(long)((long)puVar66 + uVar27)] ==
                      *(uint8_t *)((long)puVar42 + (long)((long)puVar66 + uVar23)))) {
                    puVar29 = (ulong *)((long)puVar42 + uVar23);
                    puVar37 = puVar21;
                    puVar30 = puVar29;
                    for (; (uint32_t *)0x7 < puVar24; puVar24 = puVar24 + -2) {
                      uVar23 = *puVar37;
                      uVar59 = *puVar30;
                      if (uVar23 == uVar59) {
                        puVar30 = puVar30 + 1;
                      }
                      else {
                        uVar64 = 0;
                        if ((uVar59 ^ uVar23) != 0) {
                          for (; ((uVar59 ^ uVar23) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                          }
                        }
                        puVar65 = (uint32_t *)
                                  ((long)puVar30 + ((uVar64 >> 3 & 0x1fffffff) - (long)puVar29));
                      }
                      if (uVar23 != uVar59) goto LAB_01123e05;
                      puVar37 = puVar37 + 1;
                    }
                    puVar25 = puVar30;
                    if (puVar24 != (uint32_t *)0x0) {
                      puVar25 = (ulong *)((long)puVar30 + (long)puVar24);
                      puVar38 = (uint8_t *)0x0;
                      do {
                        if (*(uint8_t *)((long)puVar30 + (long)puVar38) !=
                            *(uint8_t *)((long)puVar37 + (long)puVar38)) {
                          puVar25 = (ulong *)((long)puVar30 + (long)puVar38);
                          break;
                        }
                        puVar38 = puVar38 + 1;
                      } while (puVar24 != (uint32_t *)puVar38);
                    }
                    puVar65 = (uint32_t *)((long)puVar25 - (long)puVar29);
LAB_01123e05:
                    if ((uint32_t *)0x3 < puVar65) {
                      iVar4 = 0x1f;
                      if ((uint)puVar28 != 0) {
                        for (; (uint)puVar28 >> iVar4 == 0; iVar4 = iVar4 + -1) {
                        }
                      }
                      puVar24 = (uint32_t *)((ulong)(iVar4 * -0x1e + 0x780) + (long)puVar65 * 0x87);
                      if (local_148 < puVar24) {
                        local_150 = 0;
                        puVar66 = puVar65;
                        local_148 = puVar24;
                        local_120 = puVar65;
                        local_f8 = puVar28;
                      }
                    }
                  }
                  puVar49 = puVar49 + 1;
                } while (-1 < (int)uVar46);
              }
              sVar39 = sVar39 + 1;
            } while (sVar39 != sVar67);
          }
          bVar68 = (uint8_t *)((long)local_128 + 0xaf) <= local_148;
          iVar4 = iVar31;
          if (bVar68) {
            local_e8 = local_e8 + 1;
            local_128 = local_148;
            local_110 = local_f8;
            local_154 = local_150;
            local_130 = puVar33;
            local_e0 = local_120;
            iVar4 = iVar31 + 1;
          }
          bVar13 = iVar31 < 3;
          uVar52 = uVar52 + 1;
          iVar31 = iVar4;
        } while (bVar68 && (bVar13 && (uint8_t *)((long)puVar41 + 5) < puVar3));
        puVar41 = (uint32_t *)((long)local_130 + sVar5);
        if (puVar32 <= (uint32_t *)((long)local_130 + sVar5)) {
          puVar41 = puVar32;
        }
        puVar44 = (uint8_t *)((long)puVar41 + sVar6);
        if (puVar44 < local_110) {
LAB_0112432f:
          puVar28 = local_110 + 0xf;
        }
        else {
          uVar46 = 0;
          bVar68 = false;
          if (local_110 != (uint8_t *)(long)*dist_cache) {
            if (local_110 == (uint8_t *)(long)dist_cache[1]) {
              uVar46 = 1;
            }
            else {
              if (local_110 + (3 - (long)*dist_cache) < (uint8_t *)0x7) {
                bVar26 = (byte)((int)(local_110 + (3 - (long)*dist_cache)) << 2);
                uVar46 = 0x9750468;
              }
              else {
                if ((uint8_t *)0x6 < local_110 + (3 - (long)dist_cache[1])) {
                  if (local_110 != (uint8_t *)(long)dist_cache[2]) {
                    bVar68 = local_110 != (uint8_t *)(long)dist_cache[3];
                    uVar46 = 3;
                    goto LAB_01124326;
                  }
                  uVar46 = 2;
                  goto LAB_01124324;
                }
                bVar26 = (byte)((int)(local_110 + (3 - (long)dist_cache[1])) << 2);
                uVar46 = 0xfdb1ace;
              }
              uVar46 = uVar46 >> (bVar26 & 0x1f) & 0xf;
            }
LAB_01124324:
            bVar68 = false;
          }
LAB_01124326:
          if (bVar68) goto LAB_0112432f;
          puVar28 = (uint8_t *)(ulong)uVar46;
        }
        if ((local_110 <= puVar44) && (puVar28 != (uint8_t *)0x0)) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          iVar31 = (int)local_110;
          *dist_cache = iVar31;
          dist_cache[4] = iVar31 + -1;
          dist_cache[5] = iVar31 + 1;
          dist_cache[6] = iVar31 + -2;
          dist_cache[7] = iVar31 + 2;
          dist_cache[8] = iVar31 + -3;
          dist_cache[9] = iVar31 + 3;
        }
        uVar46 = (uint)local_e8;
        local_b8->insert_len_ = uVar46;
        local_b8->copy_len_ = local_154 << 0x19 | (uint)local_e0;
        uVar27 = (ulong)(params->dist).num_direct_distance_codes;
        puVar44 = (uint8_t *)(uVar27 + 0x10);
        if (puVar28 < puVar44) {
          local_b8->dist_prefix_ = (uint16_t)puVar28;
          uVar19 = 0;
        }
        else {
          uVar19 = (params->dist).distance_postfix_bits;
          bVar26 = (byte)uVar19;
          puVar28 = puVar28 + ((4L << (bVar26 & 0x3f)) - uVar27) + -0x10;
          uVar47 = 0x1f;
          if ((uint)puVar28 != 0) {
            for (; (uint)puVar28 >> uVar47 == 0; uVar47 = uVar47 - 1) {
            }
          }
          uVar47 = (uVar47 ^ 0xffffffe0) + 0x1f;
          bVar68 = ((ulong)puVar28 >> ((ulong)uVar47 & 0x3f) & 1) != 0;
          iVar31 = uVar47 - uVar19;
          local_b8->dist_prefix_ =
               (short)((uint)bVar68 + iVar31 * 2 + 0xfffe << (bVar26 & 0x3f)) +
               (short)puVar44 + (~(ushort)(-1 << (bVar26 & 0x1f)) & (ushort)puVar28) |
               (short)iVar31 * 0x400;
          uVar19 = (uint32_t)
                   ((long)puVar28 - ((ulong)bVar68 + 2 << ((byte)uVar47 & 0x3f)) >> (bVar26 & 0x3f))
          ;
        }
        local_b8->dist_extra_ = uVar19;
        if (5 < local_e8) {
          if (local_e8 < 0x82) {
            uVar46 = 0x1f;
            uVar47 = (uint)(local_e8 - 2);
            if (uVar47 != 0) {
              for (; uVar47 >> uVar46 == 0; uVar46 = uVar46 - 1) {
              }
            }
            uVar46 = (int)(local_e8 - 2 >> ((char)(uVar46 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar46 ^ 0xffffffe0) * 2 + 0x40;
          }
          else if (local_e8 < 0x842) {
            uVar47 = 0x1f;
            if (uVar46 - 0x42 != 0) {
              for (; uVar46 - 0x42 >> uVar47 == 0; uVar47 = uVar47 - 1) {
              }
            }
            uVar46 = (uVar47 ^ 0xffe0) + 0x2a;
          }
          else {
            uVar46 = 0x15;
            if (0x1841 < local_e8) {
              uVar46 = (uint)(ushort)(0x17 - (local_e8 < 0x5842));
            }
          }
        }
        uVar47 = local_154 + (uint)local_e0;
        if (uVar47 < 10) {
          uVar48 = uVar47 - 2;
        }
        else if (uVar47 < 0x86) {
          uVar47 = uVar47 - 6;
          uVar48 = 0x1f;
          if (uVar47 != 0) {
            for (; uVar47 >> uVar48 == 0; uVar48 = uVar48 - 1) {
            }
          }
          uVar48 = (int)((ulong)(long)(int)uVar47 >> ((char)(uVar48 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                   (uVar48 ^ 0xffffffe0) * 2 + 0x42;
        }
        else {
          uVar48 = 0x17;
          if (uVar47 < 0x846) {
            uVar48 = 0x1f;
            if (uVar47 - 0x46 != 0) {
              for (; uVar47 - 0x46 >> uVar48 == 0; uVar48 = uVar48 - 1) {
              }
            }
            uVar48 = (uVar48 ^ 0xffe0) + 0x2c;
          }
        }
        uVar52 = (ushort)uVar48;
        uVar45 = (uVar52 & 7) + ((ushort)uVar46 & 7) * 8;
        if ((((local_b8->dist_prefix_ & 0x3ff) == 0) && ((ushort)uVar46 < 8)) && (uVar52 < 0x10)) {
          if (7 < uVar52) {
            uVar45 = uVar45 + 0x40;
          }
        }
        else {
          iVar31 = ((uVar46 & 0xffff) >> 3) * 3 + ((uVar48 & 0xffff) >> 3);
          uVar45 = uVar45 + ((ushort)(0x520d40 >> ((char)iVar31 * '\x02' & 0x1fU)) & 0xc0) +
                            (short)iVar31 * 0x40 + 0x40;
        }
        local_b8->cmd_prefix_ = uVar45;
        *num_literals = *num_literals + local_e8;
        position = (long)local_130 + (long)local_e0;
        puVar41 = puVar20;
        if (position < puVar20) {
          puVar41 = (uint32_t *)position;
        }
        puVar42 = (uint32_t *)((long)local_130 + 2);
        if (local_110 < (uint8_t *)((ulong)local_e0 >> 2)) {
          puVar33 = (uint32_t *)(position + -(long)local_110 * 4);
          if ((uint32_t *)(position + -(long)local_110 * 4) < puVar42) {
            puVar33 = puVar42;
          }
          puVar42 = puVar33;
          if (puVar41 < puVar33) {
            puVar42 = puVar41;
          }
        }
        local_d0 = (uint8_t *)((long)local_130 + lVar53 + (long)local_e0 * 2);
        local_b8 = local_b8 + 1;
        if (puVar42 < puVar41) {
          pvVar8 = (hasher->privat)._H40.extra[0];
          pvVar10 = (hasher->privat)._H40.extra[1];
          uVar52 = (hasher->privat)._H42.free_slot_idx[0];
          do {
            uVar46 = (uint)(*(int *)(ringbuffer + ((ulong)puVar42 & ringbuffer_mask)) * 0x1e35a7bd)
                     >> 0x11;
            uVar27 = (ulong)uVar46;
            uVar23 = (long)puVar42 - (ulong)*(uint *)((long)pvVar8 + uVar27 * 4);
            *(char *)((long)pvVar8 + ((ulong)puVar42 & 0xffff) + 0x30000) = (char)uVar46;
            if (0xfffe < uVar23) {
              uVar23 = 0xffff;
            }
            uVar18 = uVar52 + 1;
            *(short *)((long)pvVar10 + (ulong)uVar52 * 4) = (short)uVar23;
            *(undefined2 *)((long)pvVar10 + (ulong)uVar52 * 4 + 2) =
                 *(undefined2 *)((long)pvVar8 + uVar27 * 2 + 0x20000);
            *(int *)((long)pvVar8 + uVar27 * 4) = (int)puVar42;
            *(ushort *)((long)pvVar8 + uVar27 * 2 + 0x20000) = uVar52;
            puVar42 = (uint32_t *)((long)puVar42 + 1);
            uVar52 = uVar18;
          } while (puVar41 != puVar42);
          local_e8 = 0;
LAB_01124669:
          (hasher->privat)._H42.free_slot_idx[0] = uVar18;
        }
        else {
          local_e8 = 0;
        }
      }
LAB_01124690:
      local_130 = (uint32_t *)position;
    } while ((uint32_t *)(position + 4) < puVar3);
  }
  else {
    local_b8 = commands;
  }
  *last_insert_len = (size_t)(puVar3 + (local_e8 - position));
  *num_commands = *num_commands + ((long)local_b8 - (long)commands >> 4);
  return;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}